

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.h
# Opt level: O0

string * helper::int_to_hex<unsigned_short>(string *__return_storage_ptr__,unsigned_short i)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream stream;
  undefined1 local_190 [382];
  unsigned_short local_12;
  string *psStack_10;
  unsigned_short i_local;
  
  local_12 = i;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_190,_Var1._M_c);
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(poVar3,local_12);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string int_to_hex( T i )
	{
		std::stringstream stream;
		stream << std::setfill( '0' ) << std::setw( sizeof( T ) * 2 )
			<< std::hex << i;
		return stream.str();
	}